

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-cursor.c
# Opt level: O2

int read_array(coda_cursor *cursor,void *dst)

{
  ushort *puVar1;
  coda_type_class cVar2;
  coda_dynamic_type_struct *pcVar3;
  long byte_offset;
  int iVar4;
  coda_dynamic_type_struct *pcVar5;
  ulong uVar6;
  long lVar7;
  size_t __n;
  void *dst_00;
  
  pcVar3 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar3[1].backend != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0xd7,"int read_array(const coda_cursor *, void *)");
  }
  __n = (size_t)(int)(pcVar3[3].backend * *(int *)((long)&pcVar3[2].definition + 4));
  pcVar5 = *(coda_dynamic_type_struct **)(pcVar3 + 2);
  if (*(coda_dynamic_type_struct **)(pcVar3 + 2) == (coda_dynamic_type_struct *)0x0) {
    pcVar5 = pcVar3;
  }
  cVar2 = pcVar5->definition->type_class;
  lVar7 = 0;
  dst_00 = dst;
  do {
    uVar6 = (ulong)*(int *)&pcVar3[2].definition;
    if ((long)uVar6 <= lVar7) {
      if ((cVar2 != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 != 1)) {
        switch(pcVar3[3].backend) {
        case coda_backend_binary:
          break;
        case 2:
          for (lVar7 = 0; lVar7 < (long)(int)uVar6 * (long)*(int *)((long)&pcVar3[2].definition + 4)
              ; lVar7 = lVar7 + 1) {
            puVar1 = (ushort *)((long)dst + lVar7 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            uVar6 = (ulong)*(uint *)&pcVar3[2].definition;
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                        ,0x116,"int read_array(const coda_cursor *, void *)");
        case 4:
          for (lVar7 = 0; lVar7 < (long)(int)uVar6 * (long)*(int *)((long)&pcVar3[2].definition + 4)
              ; lVar7 = lVar7 + 1) {
            swap4(dst);
            uVar6 = (ulong)*(uint *)&pcVar3[2].definition;
            dst = (void *)((long)dst + 4);
          }
          break;
        case 8:
          for (lVar7 = 0; lVar7 < (long)(int)uVar6 * (long)*(int *)((long)&pcVar3[2].definition + 4)
              ; lVar7 = lVar7 + 1) {
            swap8(dst);
            uVar6 = (ulong)*(uint *)&pcVar3[2].definition;
            dst = (void *)((long)dst + 8);
          }
        }
      }
      return 0;
    }
    byte_offset = *(long *)(*(long *)(pcVar3 + 4) + lVar7 * 8);
    if (byte_offset < 0) {
      coda_set_error(-200,"Missing record not supported for CDF variable");
      return -1;
    }
    if (pcVar3[4].definition == (coda_type *)0x0) {
      iVar4 = read_bytes((coda_product *)cursor->product[1].filename,byte_offset,__n,dst_00);
      if (iVar4 != 0) {
        return -1;
      }
    }
    else {
      memcpy(dst_00,(void *)((long)&(pcVar3[4].definition)->format + byte_offset),__n);
    }
    lVar7 = lVar7 + 1;
    dst_00 = (void *)((long)dst_00 + __n);
  } while( true );
}

Assistant:

static int read_array(const coda_cursor *cursor, void *dst)
{
    coda_cdf_variable *variable = (coda_cdf_variable *)cursor->stack[cursor->n - 1].type;
    coda_type_class type_class;
    long record_size = variable->num_values_per_record * variable->value_size;
    int i;

    assert(variable->tag == tag_cdf_variable);
    if (variable->base_type == NULL)
    {
        type_class = variable->definition->type_class;
    }
    else
    {
        type_class = variable->base_type->definition->type_class;
    }

    for (i = 0; i < variable->num_records; i++)
    {
        /* TODO: handle sparse records */
        if (variable->offset[i] < 0)
        {
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "Missing record not supported for CDF variable");
            return -1;
        }
        if (variable->data != NULL)
        {
            memcpy(&((uint8_t *)dst)[i * record_size], &variable->data[variable->offset[i]], record_size);
        }
        else
        {
            if (read_bytes(((coda_cdf_product *)cursor->product)->raw_product, variable->offset[i], record_size,
                           &((uint8_t *)dst)[i * record_size]) != 0)
            {
                return -1;
            }
        }
    }
    if (type_class != coda_text_class)
    {
#ifdef WORDS_BIGENDIAN
        coda_endianness system_endianness = coda_big_endian;
#else
        coda_endianness system_endianness = coda_little_endian;
#endif
        if (((coda_cdf_product *)cursor->product)->endianness != system_endianness)
        {
            switch (variable->value_size)
            {
                case 1:
                    break;
                case 2:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap2(&((int16_t *)dst)[i]);
                    }
                    break;
                case 4:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap4(&((int32_t *)dst)[i]);
                    }
                    break;
                case 8:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap8(&((int64_t *)dst)[i]);
                    }
                    break;
                default:
                    assert(0);
                    exit(1);
            }
        }
    }

    return 0;
}